

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void printComponent(ComponentPtr *component,bool includeMaths)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  printComponent(component,0xffffffffffffffff,&local_28,includeMaths);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void printComponent(const libcellml::ComponentPtr &component, bool includeMaths)
{
    printComponent(component, SIZE_MAX, {}, includeMaths);
}